

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_database.cpp
# Opt level: O3

void __thiscall
Database_SegmentBase_Test::~Database_SegmentBase_Test(Database_SegmentBase_Test *this)

{
  (this->super_Database).super_Test._vptr_Test = (_func_int **)&PTR__Database_0026a450;
  in_memory_store::~in_memory_store(&(this->super_Database).store_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x30);
  return;
}

Assistant:

TEST_F (Database, SegmentBase) {
    // Checks that the first segment address is equal to the address of our file backing store
    // buffer, and that all of the other segment pointers are null.

    pstore::database db{store_.file ()};
    db.set_vacuum_mode (pstore::database::vacuum_mode::disabled);

    static_assert (pstore::address::segment_size == pstore::storage::min_region_size,
                   "expected min_region_size == segment_size");

    auto ptr = store_.buffer ().get ();

    ASSERT_LE (std::numeric_limits<pstore::address::segment_type>::max (), pstore::sat_elements);

    EXPECT_EQ (std::shared_ptr<void> (store_.buffer (), ptr), db.storage ().segment_base (0));
    for (unsigned segment = 1; segment < pstore::sat_elements; ++segment) {
        auto const si = static_cast<pstore::address::segment_type> (segment);
        EXPECT_EQ (nullptr, db.storage ().segment_base (si));
    }

    // Now the same tests, but for the const method.
    auto const * dbp = &db;

    EXPECT_EQ (std::shared_ptr<void> (store_.buffer (), ptr), dbp->storage ().segment_base (0));
    for (unsigned segment = 1; segment < pstore::sat_elements; ++segment) {
        auto const si = static_cast<pstore::address::segment_type> (segment);
        EXPECT_EQ (nullptr, dbp->storage ().segment_base (si));
    }
}